

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O1

void __thiscall testing::internal::FilePath::Normalize(FilePath *this)

{
  char *pcVar1;
  size_type sVar2;
  char *pcVar3;
  size_type sVar4;
  char cVar5;
  
  pcVar1 = (this->pathname_)._M_dataplus._M_p;
  sVar2 = (this->pathname_)._M_string_length;
  pcVar3 = pcVar1;
  if (sVar2 != 0) {
    sVar4 = 0;
    do {
      cVar5 = pcVar1[sVar4];
      if (((cVar5 != '/') || (cVar5 = '/', pcVar3 == (this->pathname_)._M_dataplus._M_p)) ||
         (pcVar3[-1] != '/')) {
        *pcVar3 = cVar5;
        pcVar3 = pcVar3 + 1;
      }
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
  }
  (this->pathname_)._M_string_length = (long)pcVar3 - (long)(this->pathname_)._M_dataplus._M_p;
  *pcVar3 = '\0';
  return;
}

Assistant:

void FilePath::Normalize() {
  auto out = pathname_.begin();

  for (const char character : pathname_) {
    if (!IsPathSeparator(character)) {
      *(out++) = character;
    } else if (out == pathname_.begin() || *std::prev(out) != kPathSeparator) {
      *(out++) = kPathSeparator;
    } else {
      continue;
    }
  }

  pathname_.erase(out, pathname_.end());
}